

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.c
# Opt level: O2

uint64_t bitsel(uint64_t input,int8_t *bitnums,size_t size)

{
  uint64_t uVar1;
  size_t sVar2;
  ulong uVar3;
  
  uVar1 = 0;
  for (sVar2 = 0; size != sVar2; sVar2 = sVar2 + 1) {
    uVar3 = 0;
    if (-1 < bitnums[sVar2]) {
      uVar3 = (ulong)((input >> ((ulong)(byte)bitnums[sVar2] & 0x3f) & 1) != 0);
    }
    uVar1 = uVar3 + uVar1 * 2;
  }
  return uVar1;
}

Assistant:

static inline uint64_t bitsel(
    uint64_t input, const int8_t *bitnums, size_t size)
{
    uint64_t ret = 0;
    while (size-- > 0) {
        int bitpos = *bitnums++;
        ret <<= 1;
        if (bitpos >= 0)
            ret |= 1 & (input >> bitpos);
    }
    return ret;
}